

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void hatch_egg(void *arg,long timeout)

{
  char cVar1;
  level *lev;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  monst *pmVar7;
  monst *pmVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  char *pcVar17;
  monst *mtmp;
  xchar y;
  xchar x;
  coord cc;
  char carriedby [256];
  char monnambuf [256];
  char local_26c;
  char local_26b;
  coord local_26a;
  ulong local_268;
  int local_25c;
  undefined8 local_258;
  int local_24c;
  ulong local_248;
  uchar *local_240;
  char local_238 [8];
  uint local_230;
  char local_138 [264];
  
  if (*(int *)((long)arg + 0x50) == -1) {
    return;
  }
  iVar4 = big_to_little(*(int *)((long)arg + 0x50));
  local_248 = 0;
  if (((*(char *)((long)arg + 0x34) == '\0') && (local_248 = 1, flags.female == '\0')) &&
     (*(char *)((long)arg + 0x48) == '\x03')) {
    uVar5 = mt_random();
    local_248 = CONCAT71((int7)(CONCAT44(extraout_var,uVar5) >> 8),(char)uVar5) & 0xffffffffffffff01
    ;
  }
  uVar16 = (ulong)moves;
  bVar3 = get_obj_location((obj *)arg,&local_26b,&local_26c,0);
  if (bVar3 == '\0') {
    local_268 = 0;
    bVar14 = 0;
    mtmp = (monst *)0x0;
  }
  else {
    iVar13 = *(int *)((long)arg + 0x30);
    local_25c = iVar4;
    uVar5 = mt_random();
    mtmp = (monst *)0x0;
    uVar5 = SUB164(ZEXT416(uVar5) % SEXT816((long)iVar13),0) + 1;
    uVar12 = (ulong)uVar5;
    local_258 = CONCAT71((int7)((ulong)viz_array[local_26c] >> 8),
                         (byte)viz_array[local_26c][local_26b] >> 1 & uVar16 == timeout);
    lVar10 = (long)local_25c;
    local_268 = uVar12;
    if ((mons[lVar10].geno & 0x1000) == 0) {
      if ((mvitals[lVar10].mvflags & 3) == 0) {
        local_240 = &mvitals[lVar10].mvflags;
        cVar1 = (char)local_248;
        uVar6 = 1;
        if ((int)uVar5 < 1) {
          uVar6 = uVar5;
        }
        local_24c = uVar6 - 1;
        mtmp = (monst *)0x0;
        while( true ) {
          iVar13 = (int)uVar12;
          bVar3 = enexto(&local_26a,level,local_26b,local_26c,mons + lVar10);
          pmVar7 = mtmp;
          iVar4 = iVar13;
          if (bVar3 == '\0') break;
          pmVar7 = makemon(mons + lVar10,level,(int)local_26a.x,(int)local_26a.y,1);
          if (pmVar7 == (monst *)0x0) {
            pmVar7 = (monst *)0x0;
            break;
          }
          if ((uVar16 == timeout && cVar1 == '\0') ||
             ((*(char *)((long)arg + 0x48) == '\x03' && (pmVar7->data->mlet == '\x1e')))) {
            pmVar8 = tamedog(pmVar7,(obj *)0x0);
            mtmp = (monst *)0x0;
            if ((pmVar8 != (monst *)0x0) &&
               ((pmVar7 = pmVar8, mtmp = pmVar8, *(char *)((long)arg + 0x48) == '\x03' &&
                (pmVar8->data->mlet != '\x1e')))) {
              pmVar8->mtame = '\x14';
            }
          }
          if (((*local_240 & 1) != 0) ||
             (uVar12 = (ulong)(iVar13 - 1), mtmp = pmVar7, iVar4 = local_24c, iVar13 < 2)) break;
        }
        if (pmVar7 != (monst *)0x0) {
          mtmp = pmVar7;
        }
        uVar5 = (int)local_268 - iVar4;
        local_268 = (ulong)uVar5;
        *(int *)((long)arg + 0x30) = *(int *)((long)arg + 0x30) - uVar5;
      }
      else {
        mtmp = (monst *)0x0;
      }
    }
    bVar14 = (byte)local_258;
    iVar4 = local_25c;
  }
  if (mtmp == (monst *)0x0) {
    return;
  }
  if (bVar14 != 0) {
    pcVar9 = m_monnam(mtmp);
    pcVar17 = "";
    if ((int)local_268 < 2) {
      pcVar9 = an(pcVar9);
    }
    else {
      pcVar17 = "some ";
      pcVar9 = makeplural(pcVar9);
    }
    sprintf(local_138,"%s%s",pcVar17,pcVar9);
  }
  cVar1 = *(char *)((long)arg + 0x48);
  if (cVar1 == '\x01') {
    if (bVar14 != 0) {
      bVar2 = false;
      pline("You see %s hatch.");
      bVar15 = 1;
      goto LAB_0025e79d;
    }
LAB_0025e702:
    bVar2 = true;
    bVar15 = 0;
    goto LAB_0025e79d;
  }
  if (cVar1 != '\x04') {
    if (cVar1 == '\x03') {
      pcVar17 = locomotion(mtmp->data,"drop");
      if (bVar14 == 0) {
        pline("You feel something %s from your pack!");
      }
      else {
        pline("You see %s %s out of your pack!",local_138,pcVar17);
      }
      if ((char)local_248 == '\0') {
        pcVar17 = "Its";
        if (1 < (int)local_268) {
          pcVar17 = "Their";
        }
        pcVar9 = "mommy";
        if (flags.female == '\0') {
          pcVar9 = "daddy";
        }
        pcVar11 = ".";
        if (*(char *)((long)arg + 0x34) == '\0') {
          pcVar11 = "?";
        }
        pline("%s cries sound like \"%s%s\"",pcVar17,pcVar9,pcVar11);
        bVar15 = 1;
      }
      else {
        bVar15 = 1;
        if (mtmp->data->mlet == '\x1e') {
          verbalize("Gleep!");
        }
      }
    }
    else {
      bVar15 = 0;
      warning("egg hatched where? (%d)");
    }
    bVar2 = true;
    goto LAB_0025e79d;
  }
  bVar2 = true;
  if (bVar14 == 0) goto LAB_0025e702;
  pmVar7 = *(monst **)((long)arg + 8);
  if (pmVar7->wormno == '\0') {
    if (((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0 && ((pmVar7->data->mflags3 & 0x200) != 0))))
       )) goto LAB_0025e921;
LAB_0025e99e:
    bVar3 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
    if (bVar3 == '\0') {
      builtin_strncpy(local_238,"thin air",8);
      local_230 = local_230 & 0xffffff00;
    }
    else {
      builtin_strncpy(local_238,"empty wa",8);
      local_230 = 0x726574;
    }
    bVar15 = 0;
  }
  else {
    bVar3 = worm_known(level,pmVar7);
    if (bVar3 == '\0') goto LAB_0025e99e;
LAB_0025e921:
    uVar5 = *(uint *)&(*(monst **)((long)arg + 8))->field_0x60;
    if ((((uVar5 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0025e96d;
      goto LAB_0025e99e;
    }
    if ((uVar5 & 0x280) != 0) goto LAB_0025e99e;
LAB_0025e96d:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0025e99e;
    pcVar17 = a_monnam(*(monst **)((long)arg + 8));
    pcVar17 = s_suffix(pcVar17);
    sprintf(local_238,"%s pack",pcVar17);
    bVar15 = 1;
  }
  pcVar17 = locomotion(mtmp->data,"drop");
  pline("You see %s %s out of %s!",local_138,pcVar17,local_238);
LAB_0025e79d:
  if ((bVar14 & bVar15) == 1) {
    iVar4 = little_to_big(iVar4);
    mvitals[iVar4].mvflags = mvitals[iVar4].mvflags | 8;
    update_inventory();
  }
  if (*(int *)((long)arg + 0x30) < 1) {
    if (*(char *)((long)arg + 0x48) == '\x03') {
      useup((obj *)arg);
    }
    else {
      obj_extract_self((obj *)arg);
      obfree((obj *)arg,(obj *)0x0);
    }
  }
  else {
    attach_egg_hatch_timeout((obj *)arg);
    if (*(char *)((long)arg + 0x49) != '\0') {
      stop_timer(*(level **)((long)arg + 0x20),4,arg);
      lev = *(level **)((long)arg + 0x20);
      uVar5 = mt_random();
      start_timer(lev,(ulong)(uVar5 % 0xc + 1),2,4,arg);
    }
  }
  if (!bVar2) {
    newsym((int)local_26b,(int)local_26c);
  }
  return;
}

Assistant:

void hatch_egg(void *arg, long timeout)
{
	struct obj *egg;
	struct monst *mon, *mon2;
	coord cc;
	xchar x, y;
	boolean yours, silent, knows_egg = FALSE;
	boolean cansee_hatchspot = FALSE;
	int i, mnum, hatchcount = 0;

	egg = (struct obj *) arg;
	/* sterilized while waiting */
	if (egg->corpsenm == NON_PM) return;

	mon = mon2 = NULL;
	mnum = big_to_little(egg->corpsenm);
	/* The identity of one's father is learned, not innate */
	yours = (egg->spe || (!flags.female && carried(egg) && !rn2(2)));
	silent = (timeout != moves);	/* hatched while away */

	/* only can hatch when in INVENT, FLOOR, MINVENT */
	if (get_obj_location(egg, &x, &y, 0)) {
	    hatchcount = rnd((int)egg->quan);
	    cansee_hatchspot = cansee(x, y) && !silent;
	    if (!(mons[mnum].geno & G_UNIQ) &&
		   !(mvitals[mnum].mvflags & (G_GENOD | G_EXTINCT))) {
		for (i = hatchcount; i > 0; i--) {
		    if (!enexto(&cc, level, x, y, &mons[mnum]) ||
			 !(mon = makemon(&mons[mnum], level, cc.x, cc.y, NO_MINVENT)))
			break;
		    /* tame if your own egg hatches while you're on the
		       same dungeon level, or any dragon egg which hatches
		       while it's in your inventory */
		    if ((yours && !silent) ||
			(carried(egg) && mon->data->mlet == S_DRAGON)) {
			if ((mon2 = tamedog(mon, NULL)) != 0) {
			    mon = mon2;
			    if (carried(egg) && mon->data->mlet != S_DRAGON)
				mon->mtame = 20;
			}
		    }
		    if (mvitals[mnum].mvflags & G_EXTINCT)
			break;	/* just made last one */
		    mon2 = mon;	/* in case makemon() fails on 2nd egg */
		}
		if (!mon) mon = mon2;
		hatchcount -= i;
		egg->quan -= (long)hatchcount;
	    }
	}

	if (mon) {
	    char monnambuf[BUFSZ], carriedby[BUFSZ];
	    boolean siblings = (hatchcount > 1), redraw = FALSE;

	    if (cansee_hatchspot) {
		sprintf(monnambuf, "%s%s",
			siblings ? "some " : "",
			siblings ?
			makeplural(m_monnam(mon)) : an(m_monnam(mon)));
		/* we don't learn the egg type here because learning
		   an egg type requires either seeing the egg hatch
		   or being familiar with the egg already,
		   as well as being able to see the resulting
		   monster, checked below
		*/
	    }
	    switch (egg->where) {
		case OBJ_INVENT:
		    knows_egg = TRUE; /* true even if you are blind */
		    if (!cansee_hatchspot)
			pline("You feel something %s from your pack!",
			    locomotion(mon->data, "drop"));
		    else
			pline("You see %s %s out of your pack!",
			    monnambuf, locomotion(mon->data, "drop"));
		    if (yours) {
			pline("%s cries sound like \"%s%s\"",
			    siblings ? "Their" : "Its",
			    flags.female ? "mommy" : "daddy",
			    egg->spe ? "." : "?");
		    } else if (mon->data->mlet == S_DRAGON) {
			verbalize("Gleep!");		/* Mything eggs :-) */
		    }
		    break;

		case OBJ_FLOOR:
		    if (cansee_hatchspot) {
			knows_egg = TRUE;
			pline("You see %s hatch.", monnambuf);
			redraw = TRUE;	/* update egg's map location */
		    }
		    break;

		case OBJ_MINVENT:
		    if (cansee_hatchspot) {
			/* egg carring monster might be invisible */
			if (canseemon(level, egg->ocarry)) {
			    sprintf(carriedby, "%s pack",
				     s_suffix(a_monnam(egg->ocarry)));
			    knows_egg = TRUE;
			}
			else if (is_pool(level, mon->mx, mon->my))
			    strcpy(carriedby, "empty water");
			else
			    strcpy(carriedby, "thin air");
			pline("You see %s %s out of %s!", monnambuf,
			    locomotion(mon->data, "drop"), carriedby);
		    }
		    break;
		default:
		    warning("egg hatched where? (%d)", (int)egg->where);
		    break;
	    }

	    if (cansee_hatchspot && knows_egg)
		learn_egg_type(mnum);

	    if (egg->quan > 0) {
		/* still some eggs left */
		attach_egg_hatch_timeout(egg);
		if (egg->timed) {
		    /* replace ordinary egg timeout with a short one */
		    stop_timer(egg->olev, HATCH_EGG, egg);
		    start_timer(egg->olev, (long)rnd(12), TIMER_OBJECT,
					HATCH_EGG, egg);
		}
	    } else if (carried(egg)) {
		useup(egg);
	    } else {
		/* free egg here because we use it above */
		obj_extract_self(egg);
		obfree(egg, NULL);
	    }
	    if (redraw) newsym(x, y);
	}
}